

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_api_test.c
# Opt level: O1

int main(void)

{
  long lVar1;
  undefined4 *puVar2;
  RcApiQueryAll query;
  RcApiBrief briefs [16];
  undefined8 *local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined4 local_120 [64];
  
  _mpp_log_l(4,"mpp_api_test","rc api test start\n",0);
  local_138 = &local_128;
  local_130 = 0x10;
  rc_brief_get_all(&local_138);
  _mpp_log_l(4,"mpp_api_test","default rc api query result:\n",0);
  if (0 < local_130._4_4_) {
    puVar2 = local_120;
    lVar1 = 0;
    do {
      _mpp_log_l(4,"mpp_api_test","rc api %s type %x\n",0,*(undefined8 *)(puVar2 + -2),*puVar2);
      lVar1 = lVar1 + 1;
      puVar2 = puVar2 + 4;
    } while (lVar1 < local_130._4_4_);
  }
  _mpp_log_l(4,"mpp_api_test","add test rc api\n",0);
  rc_api_add(&test_h264_api);
  rc_api_add(&test_h265_api);
  rc_brief_get_all(&local_138);
  _mpp_log_l(4,"mpp_api_test","rc api query result after adding\n",0);
  if (0 < local_130._4_4_) {
    puVar2 = local_120;
    lVar1 = 0;
    do {
      _mpp_log_l(4,"mpp_api_test","rc api %s type %x\n",0,*(undefined8 *)(puVar2 + -2),*puVar2);
      lVar1 = lVar1 + 1;
      puVar2 = puVar2 + 4;
    } while (lVar1 < local_130._4_4_);
  }
  _mpp_log_l(4,"mpp_api_test","mpp rc api test done\n",0);
  return 0;
}

Assistant:

int main()
{
    RcApiQueryAll query;
    RcApiBrief briefs[MAX_QUERY_COUNT];
    RK_S32 i;

    mpp_log("rc api test start\n");

    query.brief = briefs;
    query.max_count = MAX_QUERY_COUNT;
    query.count = 0;

    rc_brief_get_all(&query);

    mpp_log("default rc api query result:\n");
    for (i = 0; i < query.count; i++)
        mpp_log("rc api %s type %x\n", briefs[i].name, briefs[i].type);

    mpp_log("add test rc api\n");

    rc_api_add(&test_h264_api);
    rc_api_add(&test_h265_api);

    rc_brief_get_all(&query);

    mpp_log("rc api query result after adding\n");
    for (i = 0; i < query.count; i++)
        mpp_log("rc api %s type %x\n", briefs[i].name, briefs[i].type);

    mpp_log("mpp rc api test done\n");

    return 0;
}